

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MorphableModel.hpp
# Opt level: O0

void __thiscall
eos::morphablemodel::MorphableModel::MorphableModel
          (MorphableModel *this,PcaModel *shape_model,ExpressionModel *expression_model,
          PcaModel *color_model,
          optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
          *landmark_definitions,
          vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
          *texture_coordinates,
          vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
          *texture_triangle_indices)

{
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
  *texture_coordinates_local;
  optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  *landmark_definitions_local;
  PcaModel *color_model_local;
  ExpressionModel *expression_model_local;
  PcaModel *shape_model_local;
  MorphableModel *this_local;
  
  PcaModel::PcaModel(&this->shape_model,shape_model);
  PcaModel::PcaModel(&this->color_model,color_model);
  std::
  optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
  ::optional(&this->expression_model);
  std::
  optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  ::optional(&this->landmark_definitions,landmark_definitions);
  std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::vector
            (&this->texture_coordinates,texture_coordinates);
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
            (&this->texture_triangle_indices,texture_triangle_indices);
  std::
  optional<std::variant<eos::morphablemodel::PcaModel,std::vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>>
  ::operator=((optional<std::variant<eos::morphablemodel::PcaModel,std::vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>>
               *)&this->expression_model,expression_model);
  return;
}

Assistant:

MorphableModel(
        PcaModel shape_model, ExpressionModel expression_model, PcaModel color_model,
        cpp17::optional<std::unordered_map<std::string, int>> landmark_definitions = cpp17::nullopt,
        std::vector<std::array<double, 2>> texture_coordinates = std::vector<std::array<double, 2>>(),
        std::vector<std::array<int, 3>> texture_triangle_indices = std::vector<std::array<int, 3>>())
        : shape_model(shape_model), color_model(color_model), landmark_definitions(landmark_definitions),
          texture_coordinates(texture_coordinates), texture_triangle_indices(texture_triangle_indices)
    {
        // Note: We may want to check/assert that the dimensions all match?
        this->expression_model = expression_model;
    }